

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall
despot::TabularCPT::TabularCPT
          (TabularCPT *this,NamedVar *child,
          vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_> *parents)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  pointer ppNVar1;
  NamedVar *pNVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  size_type __new_size;
  
  (this->super_CPT).super_Function.map_.
  super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CPT).super_Function.map_.
  super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CPT).super_Function.values_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CPT).super_Function.values_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CPT).super_Function.parents_.
  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CPT).super_Function.values_.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CPT).super_Function.parents_.
  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_CPT).super_Function.parents_.
  super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_CPT).super_Function.map_.
  super__Vector_base<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CPT).super_Function._vptr_Function = (_func_int **)&PTR__TabularCPT_0018f860;
  (this->sparse_values_).
  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sparse_values_).
  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sparse_values_).
  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_CPT).super_Function.child_ = child;
  std::vector<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>::operator=
            (&(this->super_CPT).super_Function.parents_,parents);
  ppNVar1 = (parents->super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(parents->
                super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>)._M_impl
                .super__Vector_impl_data._M_finish - (long)ppNVar1;
  if (lVar3 == 0) {
    iVar5 = 1;
  }
  else {
    lVar3 = lVar3 >> 3;
    iVar5 = 1;
    lVar4 = 0;
    do {
      pNVar2 = ppNVar1[lVar4];
      iVar5 = iVar5 * (int)((ulong)((long)*(pointer *)
                                           ((long)&(pNVar2->super_Variable).values_.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           + 8) -
                                   *(long *)&(pNVar2->super_Variable).values_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data) >> 5);
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  __new_size = (size_type)iVar5;
  if ((ulong)((long)(child->super_Variable).values_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(child->super_Variable).values_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0xc80) {
    this_00 = &(this->super_CPT).super_Function.values_;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(this_00,__new_size);
    if (0 < iVar5) {
      lVar3 = 0;
      do {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((this_00->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar3),
                   (long)(child->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(child->super_Variable).values_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        lVar3 = lVar3 + 0x18;
      } while (__new_size * 0x18 != lVar3);
    }
  }
  else {
    std::
    vector<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_std::allocator<std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>_>_>
    ::resize(&(this->super_CPT).super_Function.map_,__new_size);
  }
  return;
}

Assistant:

TabularCPT::TabularCPT(NamedVar* child, vector<NamedVar*> parents) {
	child_ = child;
	parents_ = parents;

	int parent_size = 1;
	for (int i = 0; i < parents.size(); i++)
		parent_size *= parents[i]->values().size();

	if (child->values().size() < 100) { // TODO: possible refactoring to use a single data structure
		values_.resize(parent_size);
		for (int i = 0; i < parent_size; i++)
			values_[i].resize(child->values().size());
	} else {
		map_.resize(parent_size);
	}
}